

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O0

ssize_t __thiscall Pl_SHA2::write(Pl_SHA2 *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  element_type *peVar2;
  Pipeline *pPVar3;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  size_t sVar4;
  uchar *local_48;
  size_t bytes;
  uchar *data;
  size_t bytes_left;
  size_t len_local;
  uchar *buf_local;
  Pl_SHA2 *this_local;
  
  sVar4 = CONCAT44(in_register_00000034,__fd);
  bytes = sVar4;
  data = (uchar *)__buf;
  if ((this->in_progress & 1U) == 0) {
    this->in_progress = true;
  }
  for (; data != (uchar *)0x0; data = data + -(long)local_48) {
    if (data < (uchar *)0x40000000) {
      local_48 = data;
    }
    else {
      local_48 = (uchar *)0x40000000;
    }
    peVar2 = std::__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->crypto);
    (*peVar2->_vptr_QPDFCryptoImpl[8])(peVar2,bytes,local_48);
    bytes = (size_t)(local_48 + bytes);
  }
  pPVar3 = Pipeline::next(&this->super_Pipeline);
  if (pPVar3 != (Pipeline *)0x0) {
    pPVar3 = Pipeline::next(&this->super_Pipeline);
    iVar1 = (*pPVar3->_vptr_Pipeline[2])(pPVar3,sVar4,__buf);
    pPVar3 = (Pipeline *)CONCAT44(extraout_var,iVar1);
  }
  return (ssize_t)pPVar3;
}

Assistant:

void
Pl_SHA2::write(unsigned char const* buf, size_t len)
{
    if (!this->in_progress) {
        this->in_progress = true;
    }

    // Write in chunks in case len is too big to fit in an int. Assume int is at least 32 bits.
    static size_t const max_bytes = 1 << 30;
    size_t bytes_left = len;
    unsigned char const* data = buf;
    while (bytes_left > 0) {
        size_t bytes = (bytes_left >= max_bytes ? max_bytes : bytes_left);
        this->crypto->SHA2_update(data, bytes);
        bytes_left -= bytes;
        data += bytes;
    }

    if (next()) {
        next()->write(buf, len);
    }
}